

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_replaceext(char *output,char *src,char *ext)

{
  char *local_1040;
  char local_1028 [8];
  char buffer [4096];
  char *ext_local;
  char *src_local;
  char *output_local;
  
  stb_splitpath(local_1028,src,3);
  if (ext == (char *)0x0) {
    strcpy(output,local_1028);
  }
  else {
    local_1040 = ext;
    if (*ext == '.') {
      local_1040 = ext + 1;
    }
    sprintf(output,"%s.%s",local_1028,local_1040);
  }
  return output;
}

Assistant:

char *stb_replaceext(char *output, char *src, char *ext)
{
   char buffer[4096];
   stb_splitpath(buffer, src, STB_PATH | STB_FILE);
   if (ext)
      sprintf(output, "%s.%s", buffer, ext[0] == '.' ? ext+1 : ext);
   else
      strcpy(output, buffer);
   return output;
}